

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_std_vector.hpp
# Opt level: O2

const_reference Omega_h::at<int>(vector<int,_std::allocator<int>_> *v,int i)

{
  pointer piVar1;
  char *pcVar2;
  undefined8 uStack_10;
  
  if (i < 0) {
    pcVar2 = "0 <= i";
    uStack_10 = 0x1d;
  }
  else {
    piVar1 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    if (i < (int)((ulong)((long)(v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish - (long)piVar1) >> 2)) {
      return piVar1 + (uint)i;
    }
    pcVar2 = "i < int(v.size())";
    uStack_10 = 0x1e;
  }
  fail("assertion %s failed at %s +%d\n",pcVar2,
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_std_vector.hpp"
       ,uStack_10);
}

Assistant:

inline typename std::vector<T>::const_reference at(
    std::vector<T> const& v, int i) {
  OMEGA_H_CHECK(0 <= i);
  OMEGA_H_CHECK(i < int(v.size()));
  return v[std::size_t(i)];
}